

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O3

void __thiscall PatternModel::removeOrderImpl(PatternModel *this,int at)

{
  long lVar1;
  int iVar2;
  Song *this_00;
  Order *this_01;
  Editor editor;
  long *local_28;
  char local_20;
  
  this_00 = Module::song(this->mModule);
  this_01 = trackerboy::Song::order(this_00);
  Module::edit((Module *)&local_28);
  iVar2 = trackerboy::Order::size(this_01);
  if (iVar2 + -1 == at) {
    aboutToRemoveLastPattern(this);
  }
  trackerboy::Order::remove(this_01,(char *)(ulong)(uint)at);
  if (local_20 == '\x01') {
    LOCK();
    lVar1 = *local_28;
    if (lVar1 == 1) {
      *local_28 = 0;
    }
    UNLOCK();
    if (lVar1 != 1) {
      QBasicMutex::unlockInternal();
    }
  }
  iVar2 = trackerboy::Order::size(this_01);
  if (this->mCursorPattern < iVar2) {
    invalidate(this,at,true);
  }
  else {
    setCursorPattern(this,iVar2 + -1);
  }
  patternCountChanged(this,iVar2);
  return;
}

Assistant:

void PatternModel::removeOrderImpl(int at) {
    auto &_order = order();
    {
        auto editor = mModule.edit();
        if (at == _order.size() - 1) {
            emit aboutToRemoveLastPattern();
        }
        _order.remove(at);
    }

    auto count = _order.size();
    if (mCursorPattern >= count) {
        setCursorPattern(count - 1);
    } else {
        invalidate(at, true);
    }
    emit patternCountChanged(count);
}